

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

void CheckClear(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  tmbstr ptVar2;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
    if (attval->value == (tmbstr)0x0) {
      ptVar2 = prvTidytmbstrdup(doc->allocator,"none");
      attval->value = ptVar2;
    }
  }
  else {
    CheckLowerCaseAttrValue(doc,node,attval);
    BVar1 = AttrValueIsAmong(attval,(ctmbstr *)&DAT_001cf6a0);
    if (BVar1 == no) {
      prvTidyReportAttrError(doc,node,attval,0x22b);
      return;
    }
  }
  return;
}

Assistant:

void CheckClear( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    ctmbstr const values[] = {"none", "left", "right", "all", NULL};

    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        if (attval->value == NULL)
            attval->value = TY_(tmbstrdup)( doc->allocator, "none" );
        return;
    }

    CheckLowerCaseAttrValue( doc, node, attval );
        
    if (!AttrValueIsAmong(attval, values))
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}